

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportfields.cpp
# Opt level: O1

void __thiscall ReportFields::setDefaults(ReportFields *this)

{
  char *pcVar1;
  char *pcVar2;
  Field *pFVar3;
  int i_1;
  int i;
  long lVar4;
  ReportFields *pRVar5;
  
  lVar4 = 0;
  pRVar5 = this;
  do {
    pcVar1 = NodeFieldNames[lVar4];
    pcVar2 = (char *)pRVar5->nodeFields[0].name._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pRVar5,0,pcVar2,(ulong)pcVar1);
    pRVar5->nodeFields[0].precision = 3;
    pRVar5->nodeFields[0].lowerLimit = 2.2250738585072014e-308;
    pRVar5->nodeFields[0].upperLimit = 1.79769313486232e+308;
    lVar4 = lVar4 + 1;
    pRVar5 = (ReportFields *)(pRVar5->nodeFields + 1);
  } while (lVar4 != 7);
  pFVar3 = this->linkFields;
  lVar4 = 0;
  do {
    pcVar1 = LinkFieldNames[lVar4];
    pcVar2 = (char *)(pFVar3->name)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pFVar3,0,pcVar2,(ulong)pcVar1);
    pFVar3->precision = 3;
    pFVar3->lowerLimit = 1.79769313486232e+308;
    pFVar3->upperLimit = 2.2250738585072014e-308;
    lVar4 = lVar4 + 1;
    pFVar3 = pFVar3 + 1;
  } while (lVar4 != 9);
  return;
}

Assistant:

void ReportFields::setDefaults()
{
    for (int i = 0; i < NUM_NODE_FIELDS; i++)
    {
        nodeFields[i].name = NodeFieldNames[i];
        nodeFields[i].precision = 3;
        nodeFields[i].lowerLimit = numeric_limits<double>::min();
        nodeFields[i].upperLimit = numeric_limits<double>::max();
    }
    for (int i = 0; i < NUM_LINK_FIELDS; i++)
    {
        linkFields[i].name = LinkFieldNames[i];
        linkFields[i].precision = 3;
        linkFields[i].lowerLimit = numeric_limits<double>::max();
        linkFields[i].upperLimit = numeric_limits<double>::min();
    }
}